

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::ExtensionRangeOptions::ByteSizeLong(ExtensionRangeOptions *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ExtensionRangeOptions_VerificationState value;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *this_00;
  reference value_00;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_01;
  reference value_01;
  uint32_t *puVar4;
  size_t sVar5;
  UninterpretedOption *msg_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *__range3_1;
  ExtensionRangeOptions_Declaration *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  ExtensionRangeOptions *this_;
  ExtensionRangeOptions *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_declaration_size(this);
  sStack_58 = (long)iVar3 + sStack_58;
  this_00 = _internal_declaration(this);
  __end3 = RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::begin(this_00);
  msg = (ExtensionRangeOptions_Declaration *)
        RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::end(this_00);
  while (bVar2 = internal::operator!=(&__end3,(iterator *)&msg), bVar2) {
    value_00 = internal::
               RepeatedPtrIterator<const_google::protobuf::ExtensionRangeOptions_Declaration>::
               operator*(&__end3);
    sVar5 = internal::WireFormatLite::
            MessageSize<google::protobuf::ExtensionRangeOptions_Declaration>(value_00);
    sStack_58 = sVar5 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::ExtensionRangeOptions_Declaration>::
    operator++(&__end3);
  }
  iVar3 = _internal_uninterpreted_option_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_01 = _internal_uninterpreted_option(this);
  __end3_1 = RepeatedPtrField<google::protobuf::UninterpretedOption>::begin(this_01);
  msg_1 = (UninterpretedOption *)
          RepeatedPtrField<google::protobuf::UninterpretedOption>::end(this_01);
  while (bVar2 = internal::operator!=(&__end3_1,(iterator *)&msg_1), bVar2) {
    value_01 = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator*
                         (&__end3_1);
    sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>(value_01);
    sStack_58 = sVar5 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator++
              (&__end3_1);
  }
  puVar4 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FeatureSet>
                        ((this->field_0)._impl_.features_);
      sStack_58 = sVar5 + 2 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      value = _internal_verification(this);
      sVar5 = internal::WireFormatLite::EnumSize(value);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t ExtensionRangeOptions::ByteSizeLong() const {
  const ExtensionRangeOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.ExtensionRangeOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.ExtensionRangeOptions.Declaration declaration = 2 [retention = RETENTION_SOURCE];
    {
      total_size += 1UL * this_._internal_declaration_size();
      for (const auto& msg : this_._internal_declaration()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // optional .google.protobuf.FeatureSet features = 50;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
    // optional .google.protobuf.ExtensionRangeOptions.VerificationState verification = 3 [default = UNVERIFIED, retention = RETENTION_SOURCE];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_verification());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}